

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

uint16_t bitset_container_minimum(bitset_container_t *container)

{
  unsigned_long_long input_num;
  int iVar1;
  long in_RDI;
  int r;
  uint64_t w;
  int32_t i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (0x3ff < local_14) {
      return 0xffff;
    }
    input_num = *(unsigned_long_long *)(*(long *)(in_RDI + 8) + (long)local_14 * 8);
    if (input_num != 0) break;
    local_14 = local_14 + 1;
  }
  iVar1 = roaring_trailing_zeroes(input_num);
  return (short)iVar1 + (short)(local_14 << 6);
}

Assistant:

uint16_t bitset_container_minimum(const bitset_container_t *container) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_trailing_zeroes(w);
      return r + i * 64;
    }
  }
  return UINT16_MAX;
}